

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_extension(lysp_ctx *ctx,lysp_stmt *stmt,lysp_ext **extensions)

{
  lysp_ext_instance **exts;
  lysp_ext *plVar1;
  lysc_ext *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  uint32_t substmt_index;
  ly_ctx *plVar8;
  ly_stmt lVar9;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_00;
  lysp_stmt *stmt_01;
  
  plVar1 = *extensions;
  if (plVar1 == (lysp_ext *)0x0) {
    plVar4 = (long *)malloc(0x40);
    if (plVar4 == (long *)0x0) goto LAB_0016bc15;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    plVar2 = plVar1[-1].compiled;
    plVar1[-1].compiled = (lysc_ext *)((long)&plVar2->name + 1);
    plVar4 = (long *)realloc(&plVar1[-1].compiled,(long)plVar2 * 0x38 + 0x40);
    if (plVar4 == (long *)0x0) {
      (*extensions)[-1].compiled = (lysc_ext *)&(*extensions)[-1].compiled[-1].field_0x2f;
LAB_0016bc15:
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_extension");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *extensions = (lysp_ext *)(plVar4 + 1);
  plVar4[lVar5 * 7 + -2] = 0;
  (plVar4 + lVar5 * 7 + -2)[1] = 0;
  plVar4[lVar5 * 7 + -4] = 0;
  (plVar4 + lVar5 * 7 + -4)[1] = 0;
  plVar4[lVar5 * 7 + -6] = 0;
  (plVar4 + lVar5 * 7 + -6)[1] = 0;
  plVar4[lVar5 * 7] = 0;
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = lydict_insert(plVar8,stmt->arg,0,(char **)(plVar4 + lVar5 * 7 + -6));
    if ((LVar3 == LY_SUCCESS) &&
       (stmt_01 = stmt->child, LVar3 = LY_SUCCESS, stmt_01 != (lysp_stmt *)0x0)) {
      plVar4 = plVar4 + lVar5 * 7;
      exts = (lysp_ext_instance **)(plVar4 + -2);
      do {
        lVar9 = stmt_01->kw;
        if ((int)lVar9 < 0xf0000) {
          if (lVar9 != LY_STMT_ARGUMENT) {
            substmt_index = (int)plVar4 - 0x20;
            if (lVar9 != LY_STMT_DESCRIPTION) {
LAB_0016be4b:
              if (ctx == (lysp_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(lVar9);
              lVar9 = LY_STMT_EXTENSION;
LAB_0016be96:
              pcVar7 = lyplg_ext_stmt2str(lVar9);
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,pcVar7);
              return LY_EVALID;
            }
LAB_0016bd27:
            LVar3 = lysp_stmt_text_field
                              (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
            goto LAB_0016bd90;
          }
          if ((char *)plVar4[-5] != (char *)0x0) {
            if (ctx == (lysp_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","argument");
            return LY_EVALID;
          }
          LVar3 = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt_01->arg);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar3 = lydict_insert(plVar8,stmt_01->arg,0,(char **)(plVar4 + -5));
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          for (stmt_00 = stmt_01->child; stmt_00 != (lysp_stmt *)0x0; stmt_00 = stmt_00->next) {
            lVar9 = stmt_00->kw;
            if (lVar9 == LY_STMT_EXTENSION_INSTANCE) {
              LVar3 = lysp_stmt_ext(ctx,stmt_00,stmt_01->kw,0,exts);
            }
            else {
              if (lVar9 != LY_STMT_YIN_ELEMENT) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar8 = (ly_ctx *)0x0;
                }
                else {
                  plVar8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar6 = lyplg_ext_stmt2str(lVar9);
                lVar9 = LY_STMT_ARGUMENT;
                goto LAB_0016be96;
              }
              LVar3 = lysp_stmt_yinelem(ctx,stmt_00,(uint16_t *)(plVar4 + -1),exts);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
          }
        }
        else {
          if (lVar9 == LY_STMT_EXTENSION_INSTANCE) {
            LVar3 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,exts);
          }
          else {
            substmt_index = (int)plVar4 - 0x18;
            if (lVar9 == LY_STMT_REFERENCE) goto LAB_0016bd27;
            if (lVar9 != LY_STMT_STATUS) goto LAB_0016be4b;
            LVar3 = lysp_stmt_status(ctx,stmt_01,(uint16_t *)(plVar4 + -1),exts);
          }
LAB_0016bd90:
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        stmt_01 = stmt_01->next;
        LVar3 = LY_SUCCESS;
      } while (stmt_01 != (lysp_stmt *)0x0);
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_extension(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_ext **extensions)
{
    struct lysp_ext *ex;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *extensions, ex, LY_EMEM);

    /* store name */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &ex->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->dsc, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->ref, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &ex->flags, &ex->exts));
            break;
        case LY_STMT_ARGUMENT:
            LY_CHECK_RET(lysp_stmt_argument(ctx, child, ex));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &ex->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_EXTENSION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}